

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

ssize_t __thiscall Fl_Preferences::RootNode::write(RootNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  FILE *__stream;
  void *__buf_00;
  char *local_28;
  char *p;
  FILE *f;
  RootNode *this_local;
  
  if (this->filename_ == (char *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    fl_make_path_for_file(this->filename_);
    __stream = (FILE *)fl_fopen(this->filename_,"wb");
    if (__stream == (FILE *)0x0) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      fprintf(__stream,"; FLTK preferences file format 1.0\n");
      fprintf(__stream,"; vendor: %s\n",this->vendor_);
      fprintf(__stream,"; application: %s\n",this->application_);
      Node::write(this->prefs_->node,(int)__stream,__buf_00,__n);
      fclose(__stream);
      iVar1 = strncmp(this->filename_,"/etc/fltk/",10);
      if (iVar1 == 0) {
        local_28 = this->filename_ + 9;
        do {
          *local_28 = '\0';
          fl_chmod(this->filename_,0x1ed);
          *local_28 = '/';
          local_28 = strchr(local_28 + 1,0x2f);
        } while (local_28 != (char *)0x0);
        fl_chmod(this->filename_,0x1a4);
      }
      this_local._4_4_ = 0;
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int Fl_Preferences::RootNode::write() {
  if (!filename_)   // RUNTIME preferences
    return -1; 
  fl_make_path_for_file(filename_);
  FILE *f = fl_fopen( filename_, "wb" );
  if ( !f )
    return -1; 
  fprintf( f, "; FLTK preferences file format 1.0\n" );
  fprintf( f, "; vendor: %s\n", vendor_ );
  fprintf( f, "; application: %s\n", application_ );
  prefs_->node->write( f );
  fclose( f );
#if !(defined(__APPLE__) || defined(WIN32))
  // unix: make sure that system prefs are user-readable
  if (strncmp(filename_, "/etc/fltk/", 10) == 0) {
    char *p;
    p = filename_ + 9;
    do {			 // for each directory to the pref file
      *p = 0;
      fl_chmod(filename_, 0755); // rwxr-xr-x
      *p = '/';
      p = strchr(p+1, '/');
    } while (p);
    fl_chmod(filename_, 0644);   // rw-r--r--
  }
#endif
  return 0;
}